

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::SetTracker
          (AccessorVerifier *this,undefined8 v,bool new_value)

{
  Nonnull<const_char_*> failure_msg;
  LogMessage LStack_48;
  string local_38;
  
  if (*(bool *)v == new_value) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (*(bool *)v,new_value,"v != new_value");
  }
  else {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    *(bool *)v = new_value;
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&LStack_48,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
             ,0x4f9,failure_msg);
  cpp::(anonymous_namespace)::AccessorVerifier::Error_abi_cxx11_(&local_38,this);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&LStack_48,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&LStack_48)
  ;
}

Assistant:

void SetTracker(bool& v, bool new_value, SourceLocation loc) {
    ABSL_CHECK_NE(v, new_value) << Error(loc);
    v = new_value;
  }